

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,long,duckdb::UnaryOperatorWrapper,duckdb::StringLengthOperator>
               (string_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  unsigned_long *puVar5;
  ulong uVar6;
  undefined1 uVar17;
  undefined1 uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  idx_t iVar22;
  char **ppcVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  string_t input;
  string_t input_00;
  string_t input_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    ppcVar23 = &(ldata->value).pointer.ptr;
    for (iVar22 = 0; count != iVar22; iVar22 = iVar22 + 1) {
      paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar23 + -1);
      uVar2 = paVar1->length;
      uVar7 = paVar1->prefix[0];
      uVar10 = paVar1->prefix[1];
      uVar13 = paVar1->prefix[2];
      uVar16 = paVar1->prefix[3];
      input.value.pointer.prefix[3] = uVar16;
      input.value.pointer.prefix[2] = uVar13;
      input.value.pointer.prefix[1] = uVar10;
      input.value.pointer.prefix[0] = uVar7;
      input.value.pointer.length = uVar2;
      input.value.pointer.ptr = *ppcVar23;
      lVar19 = StringLengthOperator::Operation<duckdb::string_t,long>(input);
      result_data[iVar22] = lVar19;
      ppcVar23 = ppcVar23 + 2;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    uVar25 = 0;
    for (uVar21 = 0; uVar21 != count + 0x3f >> 6; uVar21 = uVar21 + 1) {
      puVar5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        uVar26 = uVar25 + 0x40;
        if (count <= uVar25 + 0x40) {
          uVar26 = count;
        }
LAB_008382b0:
        ppcVar23 = &ldata[uVar25].value.pointer.ptr;
        for (; uVar20 = uVar25, uVar25 < uVar26; uVar25 = uVar25 + 1) {
          paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar23 + -1);
          uVar3 = paVar1->length;
          uVar8 = paVar1->prefix[0];
          uVar11 = paVar1->prefix[1];
          uVar14 = paVar1->prefix[2];
          uVar17 = paVar1->prefix[3];
          input_00.value.pointer.prefix[3] = uVar17;
          input_00.value.pointer.prefix[2] = uVar14;
          input_00.value.pointer.prefix[1] = uVar11;
          input_00.value.pointer.prefix[0] = uVar8;
          input_00.value.pointer.length = uVar3;
          input_00.value.pointer.ptr = *ppcVar23;
          lVar19 = StringLengthOperator::Operation<duckdb::string_t,long>(input_00);
          result_data[uVar25] = lVar19;
          ppcVar23 = ppcVar23 + 2;
        }
      }
      else {
        uVar6 = puVar5[uVar21];
        uVar26 = uVar25 + 0x40;
        if (count <= uVar25 + 0x40) {
          uVar26 = count;
        }
        if (uVar6 == 0xffffffffffffffff) goto LAB_008382b0;
        uVar20 = uVar26;
        if (uVar6 != 0) {
          ppcVar23 = &ldata[uVar25].value.pointer.ptr;
          for (uVar24 = 0; uVar20 = uVar25 + uVar24, uVar25 + uVar24 < uVar26; uVar24 = uVar24 + 1)
          {
            if ((uVar6 >> (uVar24 & 0x3f) & 1) != 0) {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar23 + -1);
              uVar4 = paVar1->length;
              uVar9 = paVar1->prefix[0];
              uVar12 = paVar1->prefix[1];
              uVar15 = paVar1->prefix[2];
              uVar18 = paVar1->prefix[3];
              input_01.value.pointer.prefix[3] = uVar18;
              input_01.value.pointer.prefix[2] = uVar15;
              input_01.value.pointer.prefix[1] = uVar12;
              input_01.value.pointer.prefix[0] = uVar9;
              input_01.value.pointer.length = uVar4;
              input_01.value.pointer.ptr = *ppcVar23;
              lVar19 = StringLengthOperator::Operation<duckdb::string_t,long>(input_01);
              result_data[uVar25 + uVar24] = lVar19;
            }
            ppcVar23 = ppcVar23 + 2;
          }
        }
      }
      uVar25 = uVar20;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}